

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.h
# Opt level: O1

bool __thiscall
lzham::task_pool::
queue_multiple_object_tasks<lzham::search_accelerator,void(lzham::search_accelerator::*)(unsigned_long_long,void*)>
          (task_pool *this,search_accelerator *pObject,
          offset_in_search_accelerator_to_subr pObject_method,uint64 first_data,uint num_tasks,
          void *pData_ptr)

{
  lzham_malloc_context pvVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  task_callback_func p_Var6;
  ulong *puVar7;
  long lVar8;
  bool bVar9;
  uint uVar10;
  undefined4 in_register_00000084;
  task_callback_func p_Var11;
  void *in_stack_00000008;
  
  uVar10 = (uint)pData_ptr;
  if (uVar10 == 0) {
    bVar9 = true;
  }
  else {
    uVar5 = 0;
    bVar9 = true;
    puVar7 = (ulong *)first_data;
    do {
      uVar10 = uVar10 - 1;
      if ((int)uVar10 < 0) break;
      p_Var6 = (task_callback_func)
               lzham::lzham_malloc((lzham *)this->m_malloc_context,(void *)0x30,0,puVar7);
      p_Var11 = (task_callback_func)0x0;
      if (p_Var6 != (task_callback_func)0x0) {
        pvVar1 = this->m_malloc_context;
        *(undefined ***)p_Var6 = &PTR_execute_task_00114d28;
        *(lzham_malloc_context *)(p_Var6 + 8) = pvVar1;
        *(search_accelerator **)(p_Var6 + 0x10) = pObject;
        *(offset_in_search_accelerator_to_subr *)(p_Var6 + 0x18) = pObject_method;
        *(uint64 *)(p_Var6 + 0x20) = first_data;
        *(undefined4 *)(p_Var6 + 0x28) = 1;
        puVar7 = (ulong *)first_data;
        p_Var11 = p_Var6;
      }
      if (p_Var11 == (task_callback_func)0x0) {
        bVar9 = false;
        bVar2 = false;
      }
      else {
        iVar3 = pthread_spin_lock((pthread_spinlock_t *)this);
        if (iVar3 != 0) {
          lzham_fail("\"spinlock: pthread_spin_lock() failed\"",
                     "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                     ,0xf4);
        }
        iVar3 = (this->m_task_stack).m_top;
        lVar8 = (long)iVar3;
        if (lVar8 < 0x40) {
          (this->m_task_stack).m_top = iVar3 + 1;
          puVar7 = (ulong *)(lVar8 * 0x20);
          (this->m_task_stack).m_stack[lVar8].m_data =
               (ulong)uVar10 + CONCAT44(in_register_00000084,num_tasks);
          (this->m_task_stack).m_stack[lVar8].m_pData_ptr = in_stack_00000008;
          (this->m_task_stack).m_stack[lVar8].field_2.m_callback = p_Var11;
          (this->m_task_stack).m_stack[lVar8].m_flags = 1;
        }
        iVar4 = pthread_spin_unlock((pthread_spinlock_t *)this);
        if (iVar4 != 0) {
          lzham_fail("\"spinlock: pthread_spin_unlock() failed\"",
                     "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                     ,0xfc);
        }
        bVar2 = false;
        if (iVar3 < 0x40) {
          uVar5 = uVar5 + 1;
          bVar2 = true;
        }
        else {
          bVar9 = false;
        }
      }
    } while (bVar2);
    if (uVar5 != 0) {
      LOCK();
      this->m_num_outstanding_tasks = this->m_num_outstanding_tasks + (ulong)uVar5;
      UNLOCK();
      lVar8 = (ulong)uVar5 + 1;
      do {
        iVar3 = sem_post((sem_t *)&this->m_tasks_available);
        if (iVar3 != 0) {
          lzham_fail("\"semaphore: sem_post() or sem_post_multiple() failed\"",
                     "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                     ,0x9f);
          return bVar9;
        }
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
    }
  }
  return bVar9;
}

Assistant:

inline bool task_pool::queue_multiple_object_tasks(S* pObject, T pObject_method, uint64 first_data, uint num_tasks, void* pData_ptr)
   {
      LZHAM_ASSERT(m_num_threads);
      LZHAM_ASSERT(pObject);
      LZHAM_ASSERT(num_tasks);
      if (!num_tasks)
         return true;

      bool status = true;

      uint total_to_release = 0;

      for (int i = num_tasks - 1; i >= 0; --i)
      {
         task tsk;

         tsk.m_pObj = lzham_new< object_task<S> >(m_malloc_context, m_malloc_context, pObject, pObject_method, cObjectTaskFlagDeleteAfterExecution);
         if (!tsk.m_pObj)
         {
            status = false;
            break;
         }

         tsk.m_data = first_data + i;
         tsk.m_pData_ptr = pData_ptr;
         tsk.m_flags = cTaskFlagObject;

         if (!m_task_stack.try_push(tsk))
         {
            status = false;
            break;
         }

         total_to_release++;
      }

      if (total_to_release)
      {
         atomic_add32(&m_num_outstanding_tasks, total_to_release);

         m_tasks_available.release(total_to_release);
      }

      return status;
   }